

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

const_reference __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::at(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
     *this,key_type *key)

{
  bool bVar1;
  mapped_type *pmVar2;
  type_error *__return_storage_ptr__;
  char *__s;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [3];
  out_of_range *anon_var_0;
  key_type *local_18;
  key_type *key_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_local;
  
  local_18 = key;
  key_local = (key_type *)this;
  bVar1 = is_object(this);
  if (!bVar1) {
    __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
    __s = type_name(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,__s,&local_b9);
    std::operator+(local_98,"cannot use at() with ",&local_b8);
    detail::type_error::create(__return_storage_ptr__,0x130,local_98);
    __cxa_throw(__return_storage_ptr__,&detail::type_error::typeinfo,detail::type_error::~type_error
               );
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
           ::at((this->m_value).object,local_18);
  return pmVar2;
}

Assistant:

const_reference at(const typename object_t::key_type& key) const
{
// at only works for objects
if (JSON_LIKELY(is_object()))
{
JSON_TRY
{
return m_value.object->at(key);
}
JSON_CATCH (std::out_of_range&)
{
// create better exception explanation
JSON_THROW(out_of_range::create(403, "key '" + key + "' not found"));
}
}